

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O2

REF_STATUS ref_adj_degree(REF_ADJ ref_adj,REF_INT node,REF_INT *degree)

{
  int iVar1;
  int iVar2;
  
  *degree = 0;
  iVar1 = -1;
  if ((-1 < node) && (node < ref_adj->nnode)) {
    iVar1 = ref_adj->first[(uint)node];
  }
  iVar2 = 1;
  for (; iVar1 != -1; iVar1 = ref_adj->item[iVar1].next) {
    *degree = iVar2;
    iVar2 = iVar2 + 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_adj_degree(REF_ADJ ref_adj, REF_INT node,
                                  REF_INT *degree) {
  REF_INT item;
  *degree = 0;

  for (item = ref_adj_first(ref_adj, node); ref_adj_valid(item);
       (item) = ref_adj_item_next(ref_adj, item))
    (*degree)++;

  return REF_SUCCESS;
}